

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

ngram_class_t *
ngram_class_new(ngram_model_t *model,int32 tag_wid,int32 start_wid,glist_t classwords)

{
  int32 iVar1;
  int iVar2;
  ngram_class_t *pnVar3;
  int32 *piVar4;
  gnode_s *pgVar5;
  long lVar6;
  float fVar7;
  double dVar8;
  
  pnVar3 = (ngram_class_t *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                          ,0x2ad);
  pnVar3->tag_wid = tag_wid;
  pnVar3->start_wid = start_wid;
  iVar1 = glist_count(classwords);
  pnVar3->n_words = iVar1;
  piVar4 = (int32 *)__ckd_calloc__((long)iVar1,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                   ,0x2b2);
  pnVar3->prob1 = piVar4;
  pnVar3->nword_hash = (ngram_hash_s *)0x0;
  pnVar3->n_hash = 0;
  fVar7 = 0.0;
  for (pgVar5 = classwords; pgVar5 != (glist_t)0x0; pgVar5 = pgVar5->next) {
    fVar7 = fVar7 + (float)(pgVar5->data).fl;
  }
  dVar8 = (double)fVar7;
  if ((1.1 < dVar8) || (dVar8 < 0.9)) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x2ba,"Total class probability is %f, will normalize\n");
    for (pgVar5 = classwords; pgVar5 != (glist_t)0x0; pgVar5 = pgVar5->next) {
      (pgVar5->data).fl = (pgVar5->data).fl / dVar8;
    }
  }
  lVar6 = 0;
  for (; classwords != (glist_t)0x0; classwords = classwords->next) {
    iVar2 = logmath_log(model->lmath,(float64)(double)(float)(classwords->data).fl);
    *(int *)((long)pnVar3->prob1 + lVar6) = iVar2;
    lVar6 = lVar6 + 4;
  }
  return pnVar3;
}

Assistant:

ngram_class_t *
ngram_class_new(ngram_model_t * model, int32 tag_wid, int32 start_wid,
                glist_t classwords)
{
    ngram_class_t *lmclass;
    gnode_t *gn;
    float32 tprob;
    int i;

    lmclass = ckd_calloc(1, sizeof(*lmclass));
    lmclass->tag_wid = tag_wid;
    /* wid_base is the wid (minus class tag) of the first word in the list. */
    lmclass->start_wid = start_wid;
    lmclass->n_words = glist_count(classwords);
    lmclass->prob1 = ckd_calloc(lmclass->n_words, sizeof(*lmclass->prob1));
    lmclass->nword_hash = NULL;
    lmclass->n_hash = 0;
    tprob = 0.0;
    for (gn = classwords; gn; gn = gnode_next(gn)) {
        tprob += gnode_float32(gn);
    }
    if (tprob > 1.1 || tprob < 0.9) {
        E_INFO("Total class probability is %f, will normalize\n", tprob);
        for (gn = classwords; gn; gn = gnode_next(gn)) {
            gn->data.fl /= tprob;
        }
    }
    for (i = 0, gn = classwords; gn; ++i, gn = gnode_next(gn)) {
        lmclass->prob1[i] = logmath_log(model->lmath, gnode_float32(gn));
    }

    return lmclass;
}